

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processestimator.cxx
# Opt level: O0

void __thiscall ProcessEstimator::~ProcessEstimator(ProcessEstimator *this)

{
  uint local_14;
  uint i;
  ProcessEstimator *this_local;
  
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ProcessEstimator_00190c60;
  if (this->aSample != (double *)0x0) {
    operator_delete__(this->aSample);
  }
  if ((this->aOne != (double *)0x0) && (this->aOne != (double *)0x0)) {
    operator_delete__(this->aOne);
  }
  if ((this->aTwo != (double *)0x0) && (this->aTwo != (double *)0x0)) {
    operator_delete__(this->aTwo);
  }
  if ((this->aThree != (double *)0x0) && (this->aTwo != (double *)0x0)) {
    operator_delete__(this->aTwo);
  }
  if (this->aDist != (double **)0x0) {
    for (local_14 = 0; local_14 < this->nLength; local_14 = local_14 + 1) {
      if (this->aDist[local_14] != (double *)0x0) {
        operator_delete__(this->aDist[local_14]);
      }
    }
    if (this->aDist != (double **)0x0) {
      operator_delete(this->aDist,8);
    }
  }
  Estimator::~Estimator(&this->super_Estimator);
  return;
}

Assistant:

ProcessEstimator::~ProcessEstimator()
{
    delete[] aSample;
	if(aOne) delete[] aOne;
	if(aTwo) delete[] aTwo;
	if(aThree) delete[] aTwo;
	if(aDist) {
		for(uint i=0; i<nLength; i++)
			delete[] aDist[i];
		delete aDist;
	}
}